

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,
          shared_ptr<mocker::ir::Addr> *args_1)

{
  shared_ptr<mocker::ir::IRInst> local_40;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::Store> inst;
  shared_ptr<mocker::ir::Addr> *args_local_1;
  shared_ptr<mocker::ir::Reg> *args_local;
  BuilderContext *this_local;
  
  inst.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_1;
  std::
  make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
            ((shared_ptr<mocker::ir::Reg> *)local_30,(shared_ptr<mocker::ir::Addr> *)args);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Store,void>
            (&local_40,(shared_ptr<mocker::ir::Store> *)local_30);
  appendInst(this,&local_40);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_40);
  std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)local_30);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }